

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O0

aiReturn aiGetMaterialFloatArray
                   (aiMaterial *pMat,char *pKey,uint type,uint index,ai_real *pOut,uint *pMax)

{
  char *pcVar1;
  bool bVar2;
  uint *puVar3;
  Logger *this;
  allocator local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  uint local_5c;
  char *pcStack_58;
  uint a_3;
  char *cur;
  uint a_2;
  uint a_1;
  uint a;
  uint iWrite;
  aiMaterialProperty *prop;
  uint *pMax_local;
  ai_real *pOut_local;
  uint index_local;
  uint type_local;
  char *pKey_local;
  aiMaterial *pMat_local;
  
  prop = (aiMaterialProperty *)pMax;
  pMax_local = (uint *)pOut;
  pOut_local._0_4_ = index;
  pOut_local._4_4_ = type;
  _index_local = pKey;
  pKey_local = (char *)pMat;
  if (pOut == (ai_real *)0x0) {
    __assert_fail("pOut != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Material/MaterialSystem.cpp"
                  ,99,
                  "aiReturn aiGetMaterialFloatArray(const aiMaterial *, const char *, unsigned int, unsigned int, ai_real *, unsigned int *)"
                 );
  }
  if (pMat != (aiMaterial *)0x0) {
    aiGetMaterialProperty(pMat,pKey,type,index,(aiMaterialProperty **)&a);
    if (_a == (aiMaterialProperty *)0x0) {
      pMat_local._4_4_ = aiReturn_FAILURE;
    }
    else {
      a_1 = 0;
      if ((_a->mType == aiPTI_Float) || (_a->mType == aiPTI_Buffer)) {
        a_1 = _a->mDataLength >> 2;
        if (prop != (aiMaterialProperty *)0x0) {
          puVar3 = std::min<unsigned_int>((uint *)prop,&a_1);
          a_1 = *puVar3;
        }
        for (a_2 = 0; a_2 < a_1; a_2 = a_2 + 1) {
          pMax_local[a_2] = *(uint *)(_a->mData + (ulong)a_2 * 4);
        }
        if (prop != (aiMaterialProperty *)0x0) {
          (prop->mKey).length = a_1;
        }
      }
      else if (_a->mType == aiPTI_Double) {
        a_1 = _a->mDataLength >> 3;
        if (prop != (aiMaterialProperty *)0x0) {
          puVar3 = std::min<unsigned_int>((uint *)prop,&a_1);
          a_1 = *puVar3;
        }
        for (cur._4_4_ = 0; cur._4_4_ < a_1; cur._4_4_ = cur._4_4_ + 1) {
          pMax_local[cur._4_4_] = (uint)(float)*(double *)(_a->mData + (ulong)cur._4_4_ * 8);
        }
        if (prop != (aiMaterialProperty *)0x0) {
          (prop->mKey).length = a_1;
        }
      }
      else if (_a->mType == aiPTI_Integer) {
        a_1 = _a->mDataLength >> 2;
        if (prop != (aiMaterialProperty *)0x0) {
          puVar3 = std::min<unsigned_int>((uint *)prop,&a_1);
          a_1 = *puVar3;
        }
        for (cur._0_4_ = 0; (uint)cur < a_1; cur._0_4_ = (uint)cur + 1) {
          pMax_local[(uint)cur] = (uint)(float)*(int *)(_a->mData + (ulong)(uint)cur * 4);
        }
        if (prop != (aiMaterialProperty *)0x0) {
          (prop->mKey).length = a_1;
        }
      }
      else {
        if (prop != (aiMaterialProperty *)0x0) {
          a_1 = (prop->mKey).length;
        }
        pcStack_58 = _a->mData + 4;
        if (_a->mDataLength < 5) {
          __assert_fail("prop->mDataLength >= 5",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Material/MaterialSystem.cpp"
                        ,0x9d,
                        "aiReturn aiGetMaterialFloatArray(const aiMaterial *, const char *, unsigned int, unsigned int, ai_real *, unsigned int *)"
                       );
        }
        if (_a->mData[_a->mDataLength - 1] != '\0') {
          __assert_fail("!prop->mData[ prop->mDataLength - 1 ]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Material/MaterialSystem.cpp"
                        ,0x9e,
                        "aiReturn aiGetMaterialFloatArray(const aiMaterial *, const char *, unsigned int, unsigned int, ai_real *, unsigned int *)"
                       );
        }
        local_5c = 0;
        while (pcStack_58 = Assimp::fast_atoreal_move<float>
                                      (pcStack_58,(float *)(pMax_local + local_5c),true),
              local_5c != a_1 - 1) {
          bVar2 = Assimp::IsSpace<char>(*pcStack_58);
          if (!bVar2) {
            this = Assimp::DefaultLogger::get();
            pcVar1 = _index_local;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_c0,pcVar1,&local_c1);
            std::operator+(&local_a0,"Material property",&local_c0);
            std::operator+(&local_80,&local_a0,
                           " is a string; failed to parse a float array out of it.");
            Assimp::Logger::error(this,&local_80);
            std::__cxx11::string::~string((string *)&local_80);
            std::__cxx11::string::~string((string *)&local_a0);
            std::__cxx11::string::~string((string *)&local_c0);
            std::allocator<char>::~allocator((allocator<char> *)&local_c1);
            return aiReturn_FAILURE;
          }
          local_5c = local_5c + 1;
        }
        if (prop != (aiMaterialProperty *)0x0) {
          (prop->mKey).length = a_1;
        }
      }
      pMat_local._4_4_ = aiReturn_SUCCESS;
    }
    return pMat_local._4_4_;
  }
  __assert_fail("pMat != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Material/MaterialSystem.cpp"
                ,100,
                "aiReturn aiGetMaterialFloatArray(const aiMaterial *, const char *, unsigned int, unsigned int, ai_real *, unsigned int *)"
               );
}

Assistant:

aiReturn aiGetMaterialFloatArray(const aiMaterial* pMat,
    const char* pKey,
    unsigned int type,
    unsigned int index,
    ai_real* pOut,
    unsigned int* pMax)
{
    ai_assert( pOut != nullptr );
    ai_assert( pMat != nullptr );

    const aiMaterialProperty* prop;
    aiGetMaterialProperty(pMat,pKey,type,index, (const aiMaterialProperty**) &prop);
    if ( nullptr == prop) {
        return AI_FAILURE;
    }

    // data is given in floats, convert to ai_real
    unsigned int iWrite = 0;
    if( aiPTI_Float == prop->mType || aiPTI_Buffer == prop->mType)  {
        iWrite = prop->mDataLength / sizeof(float);
        if (pMax) {
            iWrite = std::min(*pMax,iWrite); ;
        }

        for (unsigned int a = 0; a < iWrite; ++a) {
            pOut[ a ] = static_cast<ai_real> ( reinterpret_cast<float*>(prop->mData)[a] );
        }

        if (pMax) {
            *pMax = iWrite;
        }
    }
    // data is given in doubles, convert to float
    else if( aiPTI_Double == prop->mType)  {
        iWrite = prop->mDataLength / sizeof(double);
        if (pMax) {
            iWrite = std::min(*pMax,iWrite); ;
        }
        for (unsigned int a = 0; a < iWrite;++a)    {
            pOut[a] = static_cast<ai_real> ( reinterpret_cast<double*>(prop->mData)[a] );
        }
        if (pMax) {
            *pMax = iWrite;
        }
    }
    // data is given in ints, convert to float
    else if( aiPTI_Integer == prop->mType)  {
        iWrite = prop->mDataLength / sizeof(int32_t);
        if (pMax) {
            iWrite = std::min(*pMax,iWrite); ;
        }
        for (unsigned int a = 0; a < iWrite;++a)    {
            pOut[a] = static_cast<ai_real> ( reinterpret_cast<int32_t*>(prop->mData)[a] );
        }
        if (pMax) {
            *pMax = iWrite;
        }
    }
    // a string ... read floats separated by spaces
    else {
        if (pMax) {
            iWrite = *pMax;
        }
        // strings are zero-terminated with a 32 bit length prefix, so this is safe
        const char *cur = prop->mData + 4;
        ai_assert( prop->mDataLength >= 5 );
        ai_assert( !prop->mData[ prop->mDataLength - 1 ] );
        for ( unsigned int a = 0; ;++a) {
            cur = fast_atoreal_move<ai_real>(cur,pOut[a]);
            if ( a==iWrite-1 ) {
                break;
            }
            if ( !IsSpace(*cur) ) {
                ASSIMP_LOG_ERROR("Material property" + std::string(pKey) +
                    " is a string; failed to parse a float array out of it.");
                return AI_FAILURE;
            }
        }

        if (pMax) {
            *pMax = iWrite;
        }
    }
    return AI_SUCCESS;
}